

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O2

void __thiscall
duckdb::SelectBinder::ThrowIfUnnestInLambda(SelectBinder *this,ColumnBinding *column_binding)

{
  __node_base *p_Var1;
  BinderException *this_00;
  allocator local_39;
  string local_38;
  
  p_Var1 = &(((this->super_BaseSelectBinder).node)->unnests)._M_h._M_before_begin;
  do {
    p_Var1 = p_Var1->_M_nxt;
    if (p_Var1 == (__node_base *)0x0) {
      return;
    }
  } while ((*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor !=
            (_Hash_node_base *)column_binding->table_index) ||
          ((ulong)((long)p_Var1[4]._M_nxt - (long)p_Var1[3]._M_nxt >> 3) <=
           column_binding->column_index));
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"UNNEST in lambda expressions is not supported",&local_39);
  BinderException::BinderException(this_00,&local_38);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SelectBinder::ThrowIfUnnestInLambda(const ColumnBinding &column_binding) {
	// Extract the unnests and check if any match the column index.
	for (auto &node_pair : node.unnests) {
		auto &unnest_node = node_pair.second;

		if (unnest_node.index == column_binding.table_index) {
			if (column_binding.column_index < unnest_node.expressions.size()) {
				throw BinderException("UNNEST in lambda expressions is not supported");
			}
		}
	}
}